

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSwitch.c
# Opt level: O0

Vec_Int_t * Gia_ManComputeSwitchProbs(Gia_Man_t *pGia,int nFrames,int nPref,int fProbOne)

{
  char *pcVar1;
  Vec_Int_t *pVVar2;
  Gia_ParSwi_t *pPars;
  Gia_ParSwi_t Pars;
  int fProbOne_local;
  int nPref_local;
  int nFrames_local;
  Gia_Man_t *pGia_local;
  
  Pars.fProbTrans = fProbOne;
  Pars.fVerbose = nPref;
  Gia_ManSetDefaultParamsSwi((Gia_ParSwi_t *)&pPars);
  pPars._4_4_ = nFrames;
  pcVar1 = Abc_FrameReadFlag("seqsimframes");
  if (pcVar1 != (char *)0x0) {
    pcVar1 = Abc_FrameReadFlag("seqsimframes");
    pPars._4_4_ = atoi(pcVar1);
  }
  Pars.nWords = Pars.fVerbose;
  Pars.nRandPiFactor = (int)(Pars.fProbTrans == 0);
  Pars.nPref = (int)(Pars.fProbTrans != 0);
  pVVar2 = Gia_ManSwiSimulate(pGia,(Gia_ParSwi_t *)&pPars);
  return pVVar2;
}

Assistant:

Vec_Int_t * Gia_ManComputeSwitchProbs( Gia_Man_t * pGia, int nFrames, int nPref, int fProbOne )
{
    Gia_ParSwi_t Pars, * pPars = &Pars;
    // set the default parameters
    Gia_ManSetDefaultParamsSwi( pPars ); 
    // override some of the defaults
    pPars->nIters   = nFrames;  // set number of total timeframes
    if ( Abc_FrameReadFlag("seqsimframes") )
        pPars->nIters = atoi( Abc_FrameReadFlag("seqsimframes") );
    pPars->nPref    = nPref;    // set number of first timeframes to skip  
    // decide what should be computed
    if ( fProbOne )
    {
        // if the user asked to compute propability of 1, we do not need transition information
        pPars->fProbOne   = 1;  // enable computing probabiblity of being one
        pPars->fProbTrans = 0;  // disable computing transition probability 
    }
    else
    {
        // if the user asked for transition propabability, we do not need to compute probability of 1
        pPars->fProbOne   = 0;  // disable computing probabiblity of being one
        pPars->fProbTrans = 1;  // enable computing transition probability 
    }
    // perform the computation of switching activity
    return Gia_ManSwiSimulate( pGia, pPars );
}